

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O2

int TeleportRead(int stream,float *samples,int numsamples)

{
  SharedMemoryHandle *pSVar1;
  Stream *this;
  ulong uVar2;
  bool bVar3;
  
  pSVar1 = Teleport::GetSharedMemory();
  this = pSVar1->data->streams + stream;
  uVar2 = 0;
  if (0 < numsamples) {
    uVar2 = (ulong)(uint)numsamples;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    bVar3 = Teleport::Stream::Read(this,samples);
    if (!bVar3) {
      *samples = 0.0;
    }
    samples = samples + 1;
  }
  return this->readpos;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportRead(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        if (!s.Read(samples[n]))
            samples[n] = 0.0f;
    return s.readpos;
}